

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::Simplify(Regexp *this)

{
  Regexp *this_00;
  Regexp *sre;
  SimplifyWalker sw;
  Regexp *cre;
  CoalesceWalker cw;
  Regexp *in_stack_ffffffffffffff78;
  Walker<re2::Regexp_*> *in_stack_ffffffffffffff80;
  undefined8 local_8;
  
  CoalesceWalker::CoalesceWalker((CoalesceWalker *)in_stack_ffffffffffffff80);
  this_00 = Walker<re2::Regexp_*>::Walk
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(Regexp *)0x24cb28);
  if (this_00 == (Regexp *)0x0) {
    local_8 = (Regexp *)0x0;
  }
  else {
    SimplifyWalker::SimplifyWalker((SimplifyWalker *)in_stack_ffffffffffffff80);
    local_8 = Walker<re2::Regexp_*>::Walk
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(Regexp *)0x24cb8d);
    Decref(this_00);
    SimplifyWalker::~SimplifyWalker((SimplifyWalker *)0x24cbc9);
  }
  CoalesceWalker::~CoalesceWalker((CoalesceWalker *)0x24cbef);
  return local_8;
}

Assistant:

Regexp* Regexp::Simplify() {
  CoalesceWalker cw;
  Regexp* cre = cw.Walk(this, NULL);
  if (cre == NULL)
    return cre;
  SimplifyWalker sw;
  Regexp* sre = sw.Walk(cre, NULL);
  cre->Decref();
  return sre;
}